

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::getTopHelp(QPDFArgParser *this,ostringstream *msg)

{
  element_type *peVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  
  poVar2 = std::operator<<((ostream *)msg,"Run \"");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &((this->m).
                                    super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->whoami);
  poVar2 = std::operator<<(poVar2," --help=topic\" for help on a topic.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"Run \"");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &((this->m).
                                    super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->whoami);
  poVar2 = std::operator<<(poVar2," --help=--option\" for help on an option.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"Run \"");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &((this->m).
                                    super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->whoami);
  poVar2 = std::operator<<(poVar2," --help=all\" to see all available help.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"Topics:");
  std::endl<char,std::char_traits<char>>(poVar2);
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (p_Var3 = *(_Base_ptr *)
                 ((long)&(peVar1->help_topics)._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var3 != &(peVar1->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((ostream *)msg,"  ");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 2));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void
QPDFArgParser::getTopHelp(std::ostringstream& msg)
{
    msg << "Run \"" << m->whoami << " --help=topic\" for help on a topic." << std::endl
        << "Run \"" << m->whoami << " --help=--option\" for help on an option." << std::endl
        << "Run \"" << m->whoami << " --help=all\" to see all available help." << std::endl
        << std::endl
        << "Topics:" << std::endl;
    for (auto const& i: m->help_topics) {
        msg << "  " << i.first << ": " << i.second.short_text << std::endl;
    }
}